

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O0

void __thiscall ParserException::ParserException(ParserException *this)

{
  undefined8 *in_RDI;
  allocator *s;
  ANTLRException *in_stack_ffffffffffffffc0;
  allocator local_29;
  string local_28 [40];
  
  s = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"parsing error",s);
  ANTLRException::ANTLRException(in_stack_ffffffffffffffc0,(string *)s);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *in_RDI = &PTR__ParserException_0036cb98;
  return;
}

Assistant:

ParserException::ParserException()
: ANTLRException("parsing error")
{}